

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O2

void __thiscall Reducer::handleCondition(Reducer *this,Expression **condition)

{
  bool bVar1;
  Const *with;
  anon_union_16_6_1532cd5a_for_Literal_0 local_38;
  undefined8 local_28;
  
  if ((*condition != (Expression *)0x0) && ((*condition)->_id != ConstId)) {
    with = wasm::Builder::makeConst<int>
                     ((this->builder)._M_t.
                      super___uniq_ptr_impl<wasm::Builder,_std::default_delete<wasm::Builder>_>._M_t
                      .super__Tuple_impl<0UL,_wasm::Builder_*,_std::default_delete<wasm::Builder>_>.
                      super__Head_base<0UL,_wasm::Builder_*,_false>._M_head_impl,0);
    bVar1 = tryToReplaceChild(this,condition,(Expression *)with);
    if (!bVar1) {
      local_38.i32 = 1;
      local_28 = 2;
      wasm::Literal::operator=(&with->value,(Literal *)&local_38.func);
      wasm::Literal::~Literal((Literal *)&local_38.func);
      tryToReplaceChild(this,condition,(Expression *)with);
    }
  }
  return;
}

Assistant:

void handleCondition(Expression*& condition) {
    if (!condition) {
      return;
    }
    if (condition->is<Const>()) {
      return;
    }
    auto* c = builder->makeConst(int32_t(0));
    if (!tryToReplaceChild(condition, c)) {
      c->value = Literal(int32_t(1));
      tryToReplaceChild(condition, c);
    }
  }